

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

void slang::ast::checkForVectoredSelect(Expression *value,SourceRange range,ASTContext *context)

{
  SourceRange sourceRange;
  ValueExpressionBase *pVVar1;
  NetSymbol *pNVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  DiagCode noteCode;
  SourceLocation in_RSI;
  Expression *in_RDI;
  Diagnostic *diag;
  Symbol *sym;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  SourceLocation in_stack_ffffffffffffffd0;
  SourceLocation SVar3;
  DiagCode code;
  
  noteCode = SUB84((ulong)in_RDX >> 0x20,0);
  code = SUB84((ulong)in_RCX >> 0x20,0);
  if ((in_RDI->kind == NamedValue) || (in_RDI->kind == HierarchicalValue)) {
    pVVar1 = Expression::as<slang::ast::ValueExpressionBase>(in_RDI);
    SVar3 = (SourceLocation)pVVar1->symbol;
    if ((*(int *)SVar3 == 0x3b) &&
       (pNVar2 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0xa50a98),
       pNVar2->expansionHint == Vectored)) {
      sourceRange.endLoc = SVar3;
      sourceRange.startLoc = in_stack_ffffffffffffffd0;
      ASTContext::addDiag((ASTContext *)CONCAT44(0x970007,in_stack_ffffffffffffffc8),code,
                          sourceRange);
      Diagnostic::addNote((Diagnostic *)CONCAT44(0x50001,in_stack_ffffffffffffffb0),noteCode,in_RSI)
      ;
    }
  }
  return;
}

Assistant:

static void checkForVectoredSelect(const Expression& value, SourceRange range,
                                   const ASTContext& context) {
    if (value.kind != ExpressionKind::NamedValue && value.kind != ExpressionKind::HierarchicalValue)
        return;

    const Symbol& sym = value.as<ValueExpressionBase>().symbol;
    if (sym.kind == SymbolKind::Net && sym.as<NetSymbol>().expansionHint == NetSymbol::Vectored) {
        auto& diag = context.addDiag(diag::SelectOfVectoredNet, range);
        diag.addNote(diag::NoteDeclarationHere, sym.location);
    }
}